

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btActionInterface_*>::push_back
          (btAlignedObjectArray<btActionInterface_*> *this,btActionInterface **_Val)

{
  int iVar1;
  int _Count;
  
  iVar1 = this->m_size;
  if (iVar1 == this->m_capacity) {
    _Count = 1;
    if (iVar1 != 0) {
      _Count = iVar1 * 2;
    }
    reserve(this,_Count);
    iVar1 = this->m_size;
  }
  this->m_data[iVar1] = *_Val;
  this->m_size = iVar1 + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}